

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O2

void __thiscall QTreeWidgetItem::~QTreeWidgetItem(QTreeWidgetItem *this)

{
  QTreeWidgetItemPrivate *pQVar1;
  undefined1 uVar2;
  QTreeModel *this_00;
  qsizetype qVar3;
  undefined1 uVar4;
  QTreeWidgetItem *pQVar5;
  int i;
  uint uVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  QTreeWidgetItem *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this->_vptr_QTreeWidgetItem = (_func_int **)&PTR__QTreeWidgetItem_007ea768;
  this_00 = treeModel(this,(QTreeWidget *)0x0);
  if (this_00 == (QTreeModel *)0x0) {
    pQVar5 = this->par;
    uVar4 = false;
    uVar2 = 0;
    if (pQVar5 == (QTreeWidgetItem *)0x0) goto LAB_0054fa3a;
LAB_0054f9ca:
    uVar4 = uVar2;
    local_38 = this;
    qVar3 = QtPrivate::indexOf<QTreeWidgetItem*,QTreeWidgetItem*>(&pQVar5->children,&local_38,0);
    uVar6 = (uint)qVar3;
    if ((int)uVar6 < 0) goto LAB_0054fa3a;
    if (this_00 != (QTreeModel *)0x0) {
      QTreeModel::beginRemoveItems(this_00,this->par,uVar6,1);
    }
    pQVar5 = this->par;
    if (((pQVar5->children).d.size != 0) && ((pQVar5->children).d.ptr[uVar6 & 0x7fffffff] == this))
    {
      QList<QTreeWidgetItem_*>::takeAt(&pQVar5->children,(ulong)(uVar6 & 0x7fffffff));
    }
    if (this_00 == (QTreeModel *)0x0) goto LAB_0054fa3a;
  }
  else {
    uVar4 = this_00->skipPendingSort;
    this_00->skipPendingSort = true;
    pQVar5 = this->par;
    uVar2 = uVar4;
    if (pQVar5 != (QTreeWidgetItem *)0x0) goto LAB_0054f9ca;
    if (this_00->headerItem == this) {
      this_00->headerItem = (QTreeWidgetItem *)0x0;
      goto LAB_0054fa3a;
    }
    local_38 = this;
    qVar3 = QtPrivate::indexOf<QTreeWidgetItem*,QTreeWidgetItem*>
                      (&this_00->rootItem->children,&local_38,0);
    uVar6 = (uint)qVar3;
    if ((int)uVar6 < 0) goto LAB_0054fa3a;
    QTreeModel::beginRemoveItems(this_00,(QTreeWidgetItem *)0x0,uVar6,1);
    pQVar5 = this_00->rootItem;
    if (((pQVar5->children).d.size != 0) && ((pQVar5->children).d.ptr[uVar6 & 0x7fffffff] == this))
    {
      QList<QTreeWidgetItem_*>::takeAt(&pQVar5->children,(ulong)(uVar6 & 0x7fffffff));
    }
  }
  QAbstractItemModel::endRemoveRows();
LAB_0054fa3a:
  for (uVar7 = 0; uVar7 < (ulong)(this->children).d.size; uVar7 = uVar7 + 1) {
    pQVar5 = (this->children).d.ptr[uVar7];
    pQVar5->par = (QTreeWidgetItem *)0x0;
    pQVar5->view = (QTreeWidget *)0x0;
    (*pQVar5->_vptr_QTreeWidgetItem[1])();
  }
  QList<QTreeWidgetItem_*>::clear(&this->children);
  pQVar1 = this->d;
  if (pQVar1 != (QTreeWidgetItemPrivate *)0x0) {
    QArrayDataPointer<QVariant>::~QArrayDataPointer(&(pQVar1->display).d);
  }
  operator_delete(pQVar1,0x30);
  if (this_00 != (QTreeModel *)0x0) {
    this_00->skipPendingSort = (bool)uVar4;
  }
  QArrayDataPointer<QTreeWidgetItem_*>::~QArrayDataPointer(&(this->children).d);
  QArrayDataPointer<QList<QWidgetItemData>_>::~QArrayDataPointer(&(this->values).d);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QTreeWidgetItem::~QTreeWidgetItem()
{
    QTreeModel *model = treeModel();
    QTreeModel::SkipSorting skipSorting(model);

    if (par) {
        int i = par->children.indexOf(this);
        if (i >= 0) {
            if (model) model->beginRemoveItems(par, i, 1);
            // users _could_ do changes when connected to rowsAboutToBeRemoved,
            // so we check again to make sure 'i' is valid
            if (!par->children.isEmpty() && par->children.at(i) == this)
                par->children.takeAt(i);
            if (model) model->endRemoveItems();
        }
    } else if (model) {
        if (this == model->headerItem) {
            model->headerItem = nullptr;
        } else {
            int i = model->rootItem->children.indexOf(this);
            if (i >= 0) {
                model->beginRemoveItems(nullptr, i, 1);
                // users _could_ do changes when connected to rowsAboutToBeRemoved,
                // so we check again to make sure 'i' is valid
                if (!model->rootItem->children.isEmpty() && model->rootItem->children.at(i) == this)
                    model->rootItem->children.takeAt(i);
                model->endRemoveItems();
            }
        }
    }
    // at this point the persistent indexes for the children should also be invalidated
    // since we invalidated the parent
    for (int i = 0; i < children.size(); ++i) {
        QTreeWidgetItem *child = children.at(i);
        // make sure the child does not try to remove itself from our children list
        child->par = nullptr;
        // make sure the child does not try to remove itself from the top level list
        child->view = nullptr;
        delete child;
    }

    children.clear();
    delete d;
}